

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.h
# Opt level: O0

void __thiscall cmUseMangledMesaCommand::~cmUseMangledMesaCommand(cmUseMangledMesaCommand *this)

{
  cmUseMangledMesaCommand *this_local;
  
  ~cmUseMangledMesaCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmUseMangledMesaCommand; }